

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Music_Emu.cpp
# Opt level: O0

void __thiscall Music_Emu::fill_buf(Music_Emu *this)

{
  short *begin;
  long lVar1;
  long in_RDI;
  Music_Emu *unaff_retaddr;
  long silence;
  sample_t_conflict1 *in_stack_fffffffffffffff0;
  
  if ((*(byte *)(in_RDI + 0x15c) & 1) == 0) {
    lVar1 = in_RDI;
    blargg_vector<short>::begin((blargg_vector<short> *)(in_RDI + 0x188));
    emu_play(unaff_retaddr,lVar1,in_stack_fffffffffffffff0);
    begin = blargg_vector<short>::begin((blargg_vector<short> *)(in_RDI + 0x188));
    lVar1 = count_silence(begin,0x800);
    if (lVar1 < 0x800) {
      *(long *)(in_RDI + 0x170) = *(int *)(in_RDI + 0x158) - lVar1;
      *(undefined8 *)(in_RDI + 0x180) = 0x800;
      return;
    }
  }
  *(long *)(in_RDI + 0x178) = *(long *)(in_RDI + 0x178) + 0x800;
  return;
}

Assistant:

void Music_Emu::fill_buf()
{
	assert( !buf_remain );
	if ( !emu_track_ended_ )
	{
		emu_play( buf_size, buf.begin() );
		long silence = count_silence( buf.begin(), buf_size );
		if ( silence < buf_size )
		{
			silence_time = emu_time - silence;
			buf_remain   = buf_size;
			return;
		}
	}
	silence_count += buf_size;
}